

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCut.c
# Opt level: O0

Map_Cut_t * Map_CutTableConsider(Map_Man_t *pMan,Map_CutTable_t *p,Map_Node_t **ppNodes,int nNodes)

{
  int iVar1;
  int iVar2;
  int local_40;
  int i;
  int Place;
  Map_Cut_t *pCut;
  int nNodes_local;
  Map_Node_t **ppNodes_local;
  Map_CutTable_t *p_local;
  Map_Man_t *pMan_local;
  
  iVar2 = Map_CutTableLookup(p,ppNodes,nNodes);
  if (iVar2 == -1) {
    pMan_local = (Map_Man_t *)0x0;
  }
  else {
    if (nNodes < 1) {
      __assert_fail("nNodes > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mapper/mapperCut.c"
                    ,0x3a0,
                    "Map_Cut_t *Map_CutTableConsider(Map_Man_t *, Map_CutTable_t *, Map_Node_t **, int)"
                   );
    }
    pMan_local = (Map_Man_t *)Map_CutAlloc(pMan);
    *(char *)((long)&pMan_local->pNodeDelays + 4) = (char)nNodes;
    for (local_40 = 0; local_40 < nNodes; local_40 = local_40 + 1) {
      *(Map_Node_t **)((long)&pMan_local->nInputs + (long)local_40 * 8) = ppNodes[local_40];
    }
    if (p->pBins[iVar2] != (Map_Cut_t *)0x0) {
      __assert_fail("p->pBins[Place] == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mapper/mapperCut.c"
                    ,0x3a9,
                    "Map_Cut_t *Map_CutTableConsider(Map_Man_t *, Map_CutTable_t *, Map_Node_t **, int)"
                   );
    }
    p->pBins[iVar2] = (Map_Cut_t *)pMan_local;
    iVar1 = p->nCuts;
    p->nCuts = iVar1 + 1;
    p->pCuts[iVar1] = iVar2;
  }
  return (Map_Cut_t *)pMan_local;
}

Assistant:

Map_Cut_t * Map_CutTableConsider( Map_Man_t * pMan, Map_CutTable_t * p, Map_Node_t * ppNodes[], int nNodes )
{
    Map_Cut_t * pCut;
    int Place, i;
//    abctime clk;
    // check the cut
    Place = Map_CutTableLookup( p, ppNodes, nNodes );
    if ( Place == -1 )
        return NULL;
    assert( nNodes > 0 );
    // create the new cut
//clk = Abc_Clock();
    pCut = Map_CutAlloc( pMan );
//pMan->time1 += Abc_Clock() - clk;
    pCut->nLeaves = nNodes;
    for ( i = 0; i < nNodes; i++ )
        pCut->ppLeaves[i] = ppNodes[i];
    // add the cut to the table
    assert( p->pBins[Place] == NULL );
    p->pBins[Place] = pCut;
    // add the cut to the new list
    p->pCuts[ p->nCuts++ ] = Place;
    return pCut;
}